

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O1

void Ifn_NtkMatchPrintConfig(Ifn_Ntk_t *p,sat_solver *pSat)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  uint v;
  Ifn_Obj_t *pIVar5;
  int iVar6;
  
  v = p->nObjs;
  if ((int)v < p->nPars) {
    do {
      iVar6 = p->nInps;
      lVar4 = (long)iVar6;
      iVar1 = p->nObjs;
      bVar2 = iVar6 < iVar1;
      if (iVar6 < iVar1) {
        pIVar5 = p->Nodes + lVar4;
        iVar6 = iVar1 - iVar6;
        do {
          lVar4 = lVar4 + 1;
          if (((*(uint *)pIVar5 & 7) == 6) && ((*(uint *)pIVar5 >> 8 & 0xff) == v)) {
            if (bVar2) {
              putchar(0x20);
              goto LAB_003aa246;
            }
            break;
          }
          bVar2 = lVar4 < iVar1;
          pIVar5 = pIVar5 + 1;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      iVar6 = v - p->nParsVIni;
      if ((p->nParsVIni <= (int)v) && (iVar6 % p->nParsVNum == 0)) {
        printf(" %d=",(long)iVar6 / (long)p->nParsVNum & 0xffffffff);
      }
LAB_003aa246:
      uVar3 = sat_solver_var_value(pSat,v);
      printf("%d",(ulong)uVar3);
      v = v + 1;
    } while ((int)v < p->nPars);
  }
  return;
}

Assistant:

void Ifn_NtkMatchPrintConfig( Ifn_Ntk_t * p, sat_solver * pSat )
{
    int v, i;
    for ( v = p->nObjs; v < p->nPars; v++ )
    {
        for ( i = p->nInps; i < p->nObjs; i++ )
            if ( p->Nodes[i].Type == IFN_DSD_PRIME && (int)p->Nodes[i].iFirst == v )
                break;
        if ( i < p->nObjs )
            printf( " " );
        else if ( v >= p->nParsVIni && (v - p->nParsVIni) % p->nParsVNum == 0 )
            printf( " %d=", (v - p->nParsVIni) / p->nParsVNum );
        printf( "%d", sat_solver_var_value(pSat, v) );
    }
}